

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateI32InputAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  Instruction *inst_00;
  Instruction *decoration_00;
  bool bVar1;
  int iVar2;
  spv_result_t sVar3;
  spv_const_context psVar4;
  DiagnosticStream *pDVar5;
  AssemblyGrammar *pAVar6;
  string local_4b8;
  string local_498;
  char *local_478;
  string local_470;
  string local_450;
  DiagnosticStream local_430;
  uint32_t local_258;
  StorageClass local_254;
  uint32_t vuid;
  StorageClass storage_class;
  Instruction *local_248;
  BuiltIn local_240;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_238;
  spv_result_t local_214;
  char *pcStack_210;
  spv_result_t error;
  DiagnosticStream local_208;
  BuiltIn local_2c;
  Instruction *pIStack_28;
  BuiltIn builtin;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar4 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar4->target_env);
  if (bVar1) {
    local_2c = Decoration::builtin((Decoration *)inst_local);
    iVar2 = Decoration::struct_member_index((Decoration *)inst_local);
    decoration_00 = inst_local;
    inst_00 = pIStack_28;
    if (iVar2 != -1) {
      ValidationState_t::diag(&local_208,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
      pDVar5 = DiagnosticStream::operator<<(&local_208,(char (*) [9])0xd164fb);
      pAVar6 = ValidationState_t::grammar(this->_);
      pcStack_210 = AssemblyGrammar::lookupOperandName(pAVar6,SPV_OPERAND_TYPE_BUILT_IN,local_2c);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&stack0xfffffffffffffdf0);
      pDVar5 = DiagnosticStream::operator<<
                         (pDVar5,(char (*) [40])" cannot be used as a member decoration ");
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_208);
      return this_local._4_4_;
    }
    local_248 = pIStack_28;
    local_240 = local_2c;
    _vuid = this;
    std::function<spv_result_t(std::__cxx11::string_const&)>::
    function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateI32InputAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
              ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_238,
               (anon_class_24_3_41b08022 *)&vuid);
    sVar3 = ValidateI32(this,(Decoration *)decoration_00,inst_00,&local_238);
    std::
    function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_238);
    if (sVar3 != SPV_SUCCESS) {
      return sVar3;
    }
    local_214 = sVar3;
    local_254 = GetStorageClass(pIStack_28);
    if ((local_254 != Max) && (local_254 != Input)) {
      local_258 = GetVUIDForBuiltin(local_2c,VUIDErrorStorageClass);
      ValidationState_t::diag(&local_430,this->_,SPV_ERROR_INVALID_DATA,pIStack_28);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_450,this->_,local_258,(char *)0x0);
      pDVar5 = DiagnosticStream::operator<<(&local_430,&local_450);
      psVar4 = ValidationState_t::context(this->_);
      spvLogStringForEnv_abi_cxx11_(&local_470,psVar4->target_env);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_470);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [22])0xd15fb7);
      pAVar6 = ValidationState_t::grammar(this->_);
      local_478 = AssemblyGrammar::lookupOperandName(pAVar6,SPV_OPERAND_TYPE_BUILT_IN,local_2c);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_478);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [58])0xd18014);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_498,this,(Decoration *)inst_local,pIStack_28,pIStack_28,pIStack_28,
                 ExecutionModelMax);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_498);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [2])0xd2d509);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                (&local_4b8,this,pIStack_28);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_4b8);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)&local_450);
      DiagnosticStream::~DiagnosticStream(&local_430);
      return this_local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateI32InputAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    if (decoration.struct_member_index() != Decoration::kInvalidMember) {
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << "BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
             << " cannot be used as a member decoration ";
    }
    if (spv_result_t error = ValidateI32(
            decoration, inst,
            [this, &inst, builtin](const std::string& message) -> spv_result_t {
              uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorType);
              return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                     << _.VkErrorID(vuid)
                     << "According to the "
                     << spvLogStringForEnv(_.context()->target_env)
                     << " spec BuiltIn "
                     << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
                     << " variable needs to be a 32-bit int. " << message;
            })) {
      return error;
    }

    const spv::StorageClass storage_class = GetStorageClass(inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Input) {
      uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorStorageClass);
      return _.diag(SPV_ERROR_INVALID_DATA, &inst)
             << _.VkErrorID(vuid)
             << spvLogStringForEnv(_.context()->target_env)
             << " spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN, uint32_t(builtin))
             << " to be only used for variables with Input storage class. "
             << GetReferenceDesc(decoration, inst, inst, inst) << " "
             << GetStorageClassDesc(inst);
    }
  }

  return SPV_SUCCESS;
}